

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microfmt.hpp
# Opt level: O2

string * __thiscall
cpptrace::microfmt::format<char_const*const&,std::__cxx11::string_const&,char_const*const&>
          (string *__return_storage_ptr__,microfmt *this,char *fmt,char **args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,char **args_2)

{
  size_t sVar1;
  long lVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  byte bVar5;
  array<cpptrace::microfmt::detail::format_value,_3UL> in_stack_ffffffffffffff48;
  undefined8 local_70 [2];
  undefined4 local_60;
  char **local_58;
  undefined4 local_48;
  pointer local_40;
  undefined4 local_30;
  
  bVar5 = 0;
  sVar1 = strlen((char *)this);
  local_70[0] = *(undefined8 *)fmt;
  local_60 = 5;
  local_58 = args;
  local_48 = 3;
  local_40 = (args_1->_M_dataplus)._M_p;
  local_30 = 5;
  puVar3 = local_70;
  puVar4 = (undefined8 *)&stack0xffffffffffffff48;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *puVar3;
    puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  detail::format<3ul,char_const*>
            (__return_storage_ptr__,(detail *)this,(char *)(this + sVar1),(char *)0x0,
             in_stack_ffffffffffffff48);
  return __return_storage_ptr__;
}

Assistant:

std::string format(const char* fmt, Args&&... args) {
        return detail::format<sizeof...(args)>(fmt, fmt + std::strlen(fmt), {detail::format_value(args)...});
    }